

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL::FormulasLoader::begin__csymbol
          (FormulasLoader *this,csymbol__AttributeData *attributeData)

{
  ObjectId OVar1;
  undefined4 uVar2;
  size_t sVar3;
  UniqueId *pUVar4;
  Operator local_14;
  
  if (this->mCurrentApplyHasChild == false) {
    std::deque<COLLADASaxFWL::Operator,_std::allocator<COLLADASaxFWL::Operator>_>::
    emplace_back<COLLADASaxFWL::Operator>(&(this->mOperatorStack).c,&local_14);
    this->mCurrentCSymbolIsFunction = true;
    sVar3 = COLLADABU::URI::operator_cast_to_unsigned_long(&attributeData->definitionURL);
    if (sVar3 != 0) {
      pUVar4 = IFilePartLoader::createUniqueIdFromUrl
                         (&((this->super_HelperLoaderBase).mHandlingFilePartLoader)->
                           super_IFilePartLoader,&attributeData->definitionURL,FORMULA,false);
      uVar2 = *(undefined4 *)&pUVar4->field_0x4;
      OVar1 = pUVar4->mObjectId;
      (this->mCurrentCSymbolFunctionUniqueId).mClassId = pUVar4->mClassId;
      *(undefined4 *)&(this->mCurrentCSymbolFunctionUniqueId).field_0x4 = uVar2;
      (this->mCurrentCSymbolFunctionUniqueId).mObjectId = OVar1;
      (this->mCurrentCSymbolFunctionUniqueId).mFileId = pUVar4->mFileId;
    }
  }
  this->mCurrentApplyHasChild = true;
  return true;
}

Assistant:

bool FormulasLoader::begin__csymbol( const csymbol__AttributeData& attributeData )
	{
		if ( !mCurrentApplyHasChild )
		{
			// The csymbol appears as first child of apply. I must be a user defined function.
			mOperatorStack.push(USER_DEFINED_FUNCTION);
			mCurrentCSymbolIsFunction = true;
			if (attributeData.definitionURL)
			{
				mCurrentCSymbolFunctionUniqueId = getHandlingFilePartLoader()->createUniqueIdFromUrl(attributeData.definitionURL, COLLADAFW::Formula::ID());
			}
		}
		mCurrentApplyHasChild = true;
		return true;
	}